

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::MapTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice,
          MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,MappedTextureSubresource *MappedData)

{
  USAGE Usage;
  VulkanPhysicalDevice *pVVar1;
  Uint8 *pUVar2;
  type tVar3;
  type tVar4;
  TextureVkImpl *this_00;
  TextureFormatAttribs *pTVar5;
  Uint64 UVar6;
  uint8_t *puVar7;
  uint Alignment;
  MappedTextureSubresource *Args_1;
  ulong uVar8;
  byte bVar9;
  VkDeviceSize Offset;
  ulong uVar10;
  BufferToTextureCopyInfo *this_01;
  uint uVar11;
  undefined7 in_register_00000081;
  char (*Args_2) [77];
  TextureDesc *TexDesc;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false,_false>,_bool>
  pVar12;
  char (*in_stack_fffffffffffffeb8) [26];
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  BufferToTextureCopyInfo CopyInfo;
  MipLevelProperties MipLevelAttribs;
  VulkanDynamicAllocation Allocation;
  Box FullExtentBox;
  
  Args_2 = (char (*) [77])CONCAT71(in_register_00000081,MapType);
  uVar11 = (uint)Args_2;
  Args_1 = MappedData;
  ArraySlice_local = ArraySlice;
  MipLevel_local = MipLevel;
  DeviceContextBase<Diligent::EngineVkImplTraits>::MapTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,ArraySlice,
             MapType,MapFlags,pMapRegion,MappedData);
  this_00 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pTexture);
  TexDesc = &(this_00->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc;
  pTVar5 = GetTextureFormatAttribs
                     ((this_00->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  FullExtentBox.MinX = 0;
  FullExtentBox.MaxX = 0;
  FullExtentBox.MinY = 0;
  FullExtentBox.MaxY = 0;
  FullExtentBox.MinZ = 0;
  FullExtentBox.MaxZ = 1;
  if (pMapRegion == (Box *)0x0) {
    GetMipLevelProperties(&MipLevelAttribs,TexDesc,MipLevel);
    Args_1 = (MappedTextureSubresource *)(ulong)MipLevelAttribs.LogicalHeight;
    pMapRegion = &FullExtentBox;
    FullExtentBox.MaxX = MipLevelAttribs.LogicalWidth;
    FullExtentBox.MaxY = MipLevelAttribs.LogicalHeight;
    FullExtentBox.MaxZ = MipLevelAttribs.Depth;
  }
  Usage = (this_00->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage;
  if (Usage == USAGE_STAGING) {
    UVar6 = GetStagingTextureSubresourceOffset(TexDesc,ArraySlice,MipLevel,0x10);
    GetMipLevelProperties(&MipLevelAttribs,TexDesc,MipLevel);
    uVar10 = (ulong)pTVar5->NumComponents;
    if (pTVar5->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      uVar10 = 1;
    }
    Offset = uVar10 * pTVar5->ComponentSize * ((ulong)pMapRegion->MinX / (ulong)pTVar5->BlockWidth)
             + UVar6 + ((ulong)(MipLevelAttribs.StorageHeight * pMapRegion->MinZ + pMapRegion->MinY)
                       / (ulong)pTVar5->BlockHeight) *
                       CONCAT44(MipLevelAttribs.RowSize._4_4_,(undefined4)MipLevelAttribs.RowSize);
    puVar7 = TextureVkImpl::GetStagingDataCPUAddress(this_00);
    MappedData->pData = puVar7 + Offset;
    MappedData->Stride = CONCAT44(MipLevelAttribs.RowSize._4_4_,(undefined4)MipLevelAttribs.RowSize)
    ;
    MappedData->DepthStride =
         CONCAT44(MipLevelAttribs.DepthSliceSize._4_4_,(undefined4)MipLevelAttribs.DepthSliceSize);
    if (MapType != MAP_WRITE) {
      if ((uVar11 & 0xff) != 1) {
        return;
      }
      if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == MAP_FLAG_NONE) {
        FormatString<char[208]>
                  ((string *)&CopyInfo,
                   (char (*) [208])
                   "Vulkan backend never waits for GPU when mapping staging textures for reading. Applications must use fences or other synchronization methods to explicitly synchronize access and use MAP_FLAG_DO_NOT_WAIT flag."
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          MappedData = (MappedTextureSubresource *)0x0;
          Args_2 = (char (*) [77])0x0;
          (*(code *)DebugMessageCallback)(1,CopyInfo.RowSize,0);
        }
        std::__cxx11::string::~string((string *)&CopyInfo);
      }
      if (((this_00->super_TextureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_Desc.CPUAccessFlags & CPU_ACCESS_READ) == CPU_ACCESS_NONE) {
        FormatString<char[10],char_const*,char[76]>
                  ((string *)&CopyInfo,(Diligent *)0x7e8ddf,(char (*) [10])TexDesc,
                   (char **)
                   "\' was not created with CPU_ACCESS_READ flag and can\'t be mapped for reading",
                   (char (*) [76])Args_2);
        MappedData = (MappedTextureSubresource *)0xac2;
        DebugAssertionFailed
                  ((Char *)CopyInfo.RowSize,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xac2);
        std::__cxx11::string::~string((string *)&CopyInfo);
      }
      if ((pMapRegion->MaxZ == 0) || (pMapRegion->MaxY == 0)) {
        FormatString<char[26],char[47]>
                  ((string *)&CopyInfo,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pMapRegion->MaxZ >= 1 && pMapRegion->MaxY >= 1",
                   (char (*) [47])MappedData);
        DebugAssertionFailed
                  ((Char *)CopyInfo.RowSize,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xac5);
        std::__cxx11::string::~string((string *)&CopyInfo);
      }
      tVar3 = AlignUp<unsigned_int,unsigned_int>(pMapRegion->MaxX,(uint)pTVar5->BlockWidth);
      tVar4 = AlignUp<unsigned_int,unsigned_int>(pMapRegion->MaxY,(uint)pTVar5->BlockHeight);
      bVar9 = pTVar5->NumComponents;
      if (pTVar5->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        bVar9 = 1;
      }
      TextureVkImpl::InvalidateStagingRange
                (this_00,Offset,
                 (UVar6 - Offset) +
                 (ulong)bVar9 * (ulong)pTVar5->ComponentSize *
                 ((ulong)tVar3 / (ulong)pTVar5->BlockWidth) +
                 ((ulong)((tVar4 + (pMapRegion->MaxZ - 1) * MipLevelAttribs.StorageHeight) -
                         (uint)pTVar5->BlockHeight) / (ulong)(uint)pTVar5->BlockHeight) *
                 CONCAT44(MipLevelAttribs.RowSize._4_4_,(undefined4)MipLevelAttribs.RowSize));
      return;
    }
    if (((this_00->super_TextureBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
         .m_Desc.CPUAccessFlags & CPU_ACCESS_FLAG_LAST) != CPU_ACCESS_NONE) {
      return;
    }
    FormatString<char[10],char_const*,char[77]>
              ((string *)&CopyInfo,(Diligent *)0x7e8ddf,(char (*) [10])TexDesc,
               (char **)
               "\' was not created with CPU_ACCESS_WRITE flag and can\'t be mapped for writing",
               Args_2);
    DebugAssertionFailed
              ((Char *)CopyInfo.RowSize,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xacf);
    this_01 = &CopyInfo;
  }
  else {
    if (Usage == USAGE_DYNAMIC) {
      if (MapType != MAP_WRITE) {
        LogError<false,char[66]>
                  (false,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xa8b,(char (*) [66])
                          "Dynamic textures can be mapped for writing only in Vulkan backend");
        MappedData->pData = (PVoid)0x0;
        MappedData->Stride = 0;
        MappedData->DepthStride = 0;
        return;
      }
      if (((MapFlags & (MAP_FLAG_NO_OVERWRITE|MAP_FLAG_DISCARD)) != MAP_FLAG_NONE) &&
         (MapTextureSubresource(Diligent::ITexture*,unsigned_int,unsigned_int,Diligent::MAP_TYPE,Diligent::MAP_FLAGS,Diligent::Box_const*,Diligent::MappedTextureSubresource&)
          ::IsFirstTime == '\0')) {
        FormatString<char[102]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [102])
                   "Mapping textures with flags MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE has no effect in Vulkan backend"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(0,MipLevelAttribs._0_8_,0,0,0);
        }
        std::__cxx11::string::~string((string *)&MipLevelAttribs);
        MapTextureSubresource(Diligent::ITexture*,unsigned_int,unsigned_int,Diligent::MAP_TYPE,Diligent::MAP_FLAGS,Diligent::Box_const*,Diligent::MappedTextureSubresource&)
        ::IsFirstTime = '\x01';
      }
      pVVar1 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
               m_PhysicalDevice)._M_t.
               super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
               ._M_t.
               super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
               .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
      GetBufferToTextureCopyInfo
                (&CopyInfo,
                 (this_00->super_TextureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                 .m_Desc.Format,pMapRegion,*(Uint32 *)((long)&(pVVar1->m_Properties).limits + 0x1e8)
                );
      uVar10 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x1e0);
      uVar8 = 4;
      if (4 < uVar10) {
        uVar8 = uVar10;
      }
      uVar11 = (uint)pTVar5->ComponentSize;
      if (pTVar5->ComponentSize < uVar8) {
        uVar11 = (uint)uVar8;
      }
      Alignment = (uint)uVar8;
      if (pTVar5->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        Alignment = uVar11;
      }
      AllocateDynamicSpace
                (&Allocation,this,
                 CONCAT44(CopyInfo.MemorySize._4_4_,(undefined4)CopyInfo.MemorySize),Alignment);
      if (Allocation.pDynamicMemMgr == (VulkanDynamicMemoryManager *)0x0) {
        return;
      }
      pUVar2 = (Allocation.pDynamicMemMgr)->m_CPUAddress;
      MappedData->Stride = CopyInfo.RowStride;
      MappedData->DepthStride =
           CONCAT44(CopyInfo.DepthStride._4_4_,(undefined4)CopyInfo.DepthStride);
      MipLevelAttribs.DepthSliceSize._0_4_ = (undefined4)CopyInfo.MemorySize;
      MipLevelAttribs.DepthSliceSize._4_4_ = CopyInfo.MemorySize._4_4_;
      MipLevelAttribs.MipSize._0_4_ = CopyInfo.Region.MinX;
      MipLevelAttribs.MipSize._4_4_ = CopyInfo.Region.MaxX;
      MipLevelAttribs.Depth = CopyInfo.RowStrideInTexels;
      MipLevelAttribs._20_4_ = CopyInfo.RowCount;
      MipLevelAttribs.RowSize._0_4_ = (undefined4)CopyInfo.DepthStride;
      MipLevelAttribs.RowSize._4_4_ = CopyInfo.DepthStride._4_4_;
      MipLevelAttribs.LogicalWidth = (undefined4)CopyInfo.RowSize;
      MipLevelAttribs.LogicalHeight = CopyInfo.RowSize._4_4_;
      MipLevelAttribs.StorageWidth = (undefined4)CopyInfo.RowStride;
      MipLevelAttribs.StorageHeight = CopyInfo.RowStride._4_4_;
      MappedData->pData = pUVar2 + Allocation.AlignedOffset;
      Allocation.pDynamicMemMgr = (VulkanDynamicMemoryManager *)0x0;
      Allocation.AlignedOffset = 0;
      Allocation.Size = 0;
      Allocation.dvpFrameNumber = 0;
      pVar12 = std::
               _Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>,std::allocator<std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<Diligent::DeviceContextVkImpl::MappedTextureKey,Diligent::DeviceContextVkImpl::MappedTexture>
                         ((_Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>,std::allocator<std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->m_MappedTextures);
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      FormatString<char[11],unsigned_int,char[9],unsigned_int,char[14],char_const*,char[26]>
                ((string *)&MipLevelAttribs,(Diligent *)"Mip level ",(char (*) [11])&MipLevel_local,
                 (uint *)", slice ",(char (*) [9])&ArraySlice_local,(uint *)0x6e35fc,
                 (char (*) [14])TexDesc,(char **)"\' has already been mapped",
                 in_stack_fffffffffffffeb8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,MipLevelAttribs._0_8_,0,0,0);
      }
    }
    else {
      CopyInfo.RowSize = (Uint64)GetUsageString(Usage);
      FormatString<char_const*,char[56]>
                ((string *)&MipLevelAttribs,(Diligent *)&CopyInfo,
                 (char **)" textures cannot currently be mapped in Vulkan back-end",
                 (char (*) [56])Args_1);
      DebugAssertionFailed
                ((Char *)MipLevelAttribs._0_8_,"MapTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xad5);
    }
    this_01 = (BufferToTextureCopyInfo *)&MipLevelAttribs;
  }
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void DeviceContextVkImpl::MapTextureSubresource(ITexture*                 pTexture,
                                                Uint32                    MipLevel,
                                                Uint32                    ArraySlice,
                                                MAP_TYPE                  MapType,
                                                MAP_FLAGS                 MapFlags,
                                                const Box*                pMapRegion,
                                                MappedTextureSubresource& MappedData)
{
    TDeviceContextBase::MapTextureSubresource(pTexture, MipLevel, ArraySlice, MapType, MapFlags, pMapRegion, MappedData);

    TextureVkImpl&              TextureVk  = *ClassPtrCast<TextureVkImpl>(pTexture);
    const TextureDesc&          TexDesc    = TextureVk.GetDesc();
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    Box FullExtentBox;
    if (pMapRegion == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);

        FullExtentBox.MaxX = MipLevelAttribs.LogicalWidth;
        FullExtentBox.MaxY = MipLevelAttribs.LogicalHeight;
        FullExtentBox.MaxZ = MipLevelAttribs.Depth;
        pMapRegion         = &FullExtentBox;
    }

    if (TexDesc.Usage == USAGE_DYNAMIC)
    {
        if (MapType != MAP_WRITE)
        {
            LOG_ERROR("Dynamic textures can be mapped for writing only in Vulkan backend");
            MappedData = MappedTextureSubresource{};
            return;
        }

        if ((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0)
            LOG_INFO_MESSAGE_ONCE("Mapping textures with flags MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE has no effect in Vulkan backend");

        const VkPhysicalDeviceLimits& DeviceLimits = m_pDevice->GetPhysicalDevice().GetProperties().limits;
        const BufferToTextureCopyInfo CopyInfo     = GetBufferToTextureCopyInfo(TexDesc.Format, *pMapRegion, static_cast<Uint32>(DeviceLimits.optimalBufferCopyRowPitchAlignment));
        // Source buffer offset must be multiple of 4 (18.4)
        VkDeviceSize Alignment = std::max(DeviceLimits.optimalBufferCopyOffsetAlignment, VkDeviceSize{4});
        // If the calling command's VkImage parameter is a compressed image, bufferOffset must be a multiple of
        // the compressed texel block size in bytes (18.4)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            Alignment = std::max(Alignment, VkDeviceSize{FmtAttribs.ComponentSize});
        }
        if (VulkanDynamicAllocation Allocation = AllocateDynamicSpace(CopyInfo.MemorySize, static_cast<Uint32>(Alignment)))
        {
            MappedData.pData       = reinterpret_cast<Uint8*>(Allocation.pDynamicMemMgr->GetCPUAddress()) + Allocation.AlignedOffset;
            MappedData.Stride      = CopyInfo.RowStride;
            MappedData.DepthStride = CopyInfo.DepthStride;

            auto it = m_MappedTextures.emplace(MappedTextureKey{&TextureVk, MipLevel, ArraySlice}, MappedTexture{CopyInfo, std::move(Allocation)});
            if (!it.second)
                LOG_ERROR_MESSAGE("Mip level ", MipLevel, ", slice ", ArraySlice, " of texture '", TexDesc.Name, "' has already been mapped");
        }
    }
    else if (TexDesc.Usage == USAGE_STAGING)
    {
        Uint64 SubresourceOffset =
            GetStagingTextureSubresourceOffset(TexDesc, ArraySlice, MipLevel, TextureVkImpl::StagingBufferOffsetAlignment);
        const MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
        Uint64 MapStartOffset = SubresourceOffset +
            // For compressed-block formats, RowSize is the size of one compressed row.
            // For non-compressed formats, BlockHeight is 1.
            (pMapRegion->MinZ * MipLevelAttribs.StorageHeight + pMapRegion->MinY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize +
            // For non-compressed formats, BlockWidth is 1.
            pMapRegion->MinX / FmtAttribs.BlockWidth * Uint64{FmtAttribs.GetElementSize()};

        MappedData.pData       = TextureVk.GetStagingDataCPUAddress() + MapStartOffset;
        MappedData.Stride      = MipLevelAttribs.RowSize;
        MappedData.DepthStride = MipLevelAttribs.DepthSliceSize;

        if (MapType == MAP_READ)
        {
            if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == 0)
            {
                LOG_WARNING_MESSAGE("Vulkan backend never waits for GPU when mapping staging textures for reading. "
                                    "Applications must use fences or other synchronization methods to explicitly synchronize "
                                    "access and use MAP_FLAG_DO_NOT_WAIT flag.");
            }

            DEV_CHECK_ERR((TexDesc.CPUAccessFlags & CPU_ACCESS_READ), "Texture '", TexDesc.Name, "' was not created with CPU_ACCESS_READ flag and can't be mapped for reading");
            // Readback memory is not created with HOST_COHERENT flag, so we have to explicitly invalidate the mapped range
            // to make device writes visible to CPU reads
            VERIFY_EXPR(pMapRegion->MaxZ >= 1 && pMapRegion->MaxY >= 1);
            Uint32 BlockAlignedMaxX = AlignUp(pMapRegion->MaxX, Uint32{FmtAttribs.BlockWidth});
            Uint32 BlockAlignedMaxY = AlignUp(pMapRegion->MaxY, Uint32{FmtAttribs.BlockHeight});
            Uint64 MapEndOffset     = SubresourceOffset +
                ((pMapRegion->MaxZ - 1) * MipLevelAttribs.StorageHeight + (BlockAlignedMaxY - FmtAttribs.BlockHeight)) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize +
                (BlockAlignedMaxX / FmtAttribs.BlockWidth) * Uint64{FmtAttribs.GetElementSize()};
            TextureVk.InvalidateStagingRange(MapStartOffset, MapEndOffset - MapStartOffset);
        }
        else if (MapType == MAP_WRITE)
        {
            DEV_CHECK_ERR((TexDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Texture '", TexDesc.Name, "' was not created with CPU_ACCESS_WRITE flag and can't be mapped for writing");
            // Nothing needs to be done when mapping texture for writing
        }
    }
    else
    {
        UNSUPPORTED(GetUsageString(TexDesc.Usage), " textures cannot currently be mapped in Vulkan back-end");
    }
}